

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O3

bool __thiscall ON_LineCurve::Extend(ON_LineCurve *this,ON_Interval *domain)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  double *pdVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar8;
  ON_3dPoint Q1;
  ON_3dPoint Q0;
  ON_3dVector V;
  undefined4 local_e0;
  ON_3dPoint local_b8;
  ON_3dPoint local_98;
  ON_Line local_78;
  ON_Interval local_48;
  ON_3dVector local_38;
  
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  dVar3 = ON_Interval::Length((ON_Interval *)&local_78);
  ON_Line::Direction(&local_38,&this->m_line);
  local_98.z = (this->m_line).from.z;
  local_98.x = (this->m_line).from.x;
  local_98.y = (this->m_line).from.y;
  local_b8.z = (this->m_line).to.z;
  local_b8.x._0_4_ = *(undefined4 *)&(this->m_line).to.x;
  local_b8.x._4_4_ = *(undefined4 *)((long)&(this->m_line).to.x + 4);
  local_b8.y._0_4_ = *(undefined4 *)&(this->m_line).to.y;
  local_b8.y._4_4_ = *(undefined4 *)((long)&(this->m_line).to.y + 4);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  pdVar6 = ON_Interval::operator[]((ON_Interval *)&local_78,0);
  dVar1 = *pdVar6;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  pdVar6 = ON_Interval::operator[]((ON_Interval *)&local_78,1);
  local_e0 = SUB84(*pdVar6,0);
  dVar4 = ON_Interval::operator[](domain,1);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  pdVar6 = ON_Interval::operator[]((ON_Interval *)&local_78,1);
  dVar2 = *pdVar6;
  uVar7 = SUB84(dVar4,0);
  uVar8 = (undefined4)((ulong)dVar4 >> 0x20);
  if (dVar2 < dVar4) {
    dVar5 = ON_Interval::operator[](domain,1);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    local_48.m_t[1] = (double)CONCAT44(uVar8,uVar7);
    pdVar6 = ON_Interval::operator[](&local_48,1);
    ::operator*((ON_3dVector *)&local_78,(dVar5 - *pdVar6) / dVar3,&local_38);
    ON_3dPoint::operator+=(&local_b8,(ON_3dVector *)&local_78);
    dVar5 = ON_Interval::operator[](domain,1);
    local_e0 = SUB84(dVar5,0);
  }
  dVar5 = ON_Interval::operator[](domain,0);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  local_78.from.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  local_78.from.y = (double)CONCAT44(uVar8,uVar7);
  pdVar6 = ON_Interval::operator[]((ON_Interval *)&local_78,0);
  if (*pdVar6 <= dVar5) {
    uVar7 = SUB84(dVar1,0);
    if (dVar4 <= dVar2) {
      return false;
    }
  }
  else {
    dVar1 = ON_Interval::operator[](domain,0);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    local_48.m_t[1] = (double)CONCAT44(uVar8,uVar7);
    pdVar6 = ON_Interval::operator[](&local_48,0);
    ::operator*((ON_3dVector *)&local_78,(dVar1 - *pdVar6) / dVar3,&local_38);
    ON_3dPoint::operator+=(&local_98,(ON_3dVector *)&local_78);
    dVar1 = ON_Interval::operator[](domain,0);
    uVar7 = SUB84(dVar1,0);
  }
  to_pt.x._4_4_ = local_b8.x._4_4_;
  to_pt.x._0_4_ = local_b8.x._0_4_;
  to_pt.y._4_4_ = local_b8.y._4_4_;
  to_pt.y._0_4_ = local_b8.y._0_4_;
  from_pt.y = local_98.y;
  from_pt.x = local_98.x;
  from_pt.z = local_98.z;
  to_pt.z = local_b8.z;
  ON_Line::ON_Line(&local_78,from_pt,to_pt);
  (this->m_line).to.y = local_78.to.y;
  (this->m_line).to.z = local_78.to.z;
  (this->m_line).from.z = local_78.from.z;
  (this->m_line).to.x = local_78.to.x;
  (this->m_line).from.x = local_78.from.x;
  (this->m_line).from.y = local_78.from.y;
  ON_Line::~ON_Line(&local_78);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
            (uVar7,local_e0,this);
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return true;
}

Assistant:

bool ON_LineCurve::Extend(
  const ON_Interval& domain
  )

{
  double len = Domain().Length();
  ON_3dVector V = m_line.Direction();
  ON_3dPoint Q0 = m_line.from;
  ON_3dPoint Q1 = m_line.to;
  double t0 = Domain()[0];
  double t1 = Domain()[1];
  bool do_it = false;
  if (domain[1] > Domain()[1]) {
    Q1 += (domain[1]-Domain()[1])/len*V;
    t1 = domain[1];
    do_it = true;
  }
  if (domain[0] < Domain()[0]) {
    Q0 += (domain[0]-Domain()[0])/len*V;
    t0 = domain[0];
    do_it = true;
  }

  if (do_it){
    m_line = ON_Line(Q0, Q1);
    SetDomain(t0, t1);
    DestroyCurveTree();
  }
  return do_it;
}